

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall google::protobuf::io::CodedInputStream::Skip(CodedInputStream *this,int count)

{
  int iVar1;
  int in_ESI;
  CodedInputStream *in_RDI;
  int original_buffer_size;
  undefined1 local_1;
  
  if (in_ESI < 0) {
    local_1 = false;
  }
  else {
    iVar1 = BufferSize(in_RDI);
    if (iVar1 < in_ESI) {
      local_1 = SkipFallback((CodedInputStream *)CONCAT44(in_ESI,iVar1),(int)((ulong)in_RDI >> 0x20)
                             ,(int)in_RDI);
    }
    else {
      Advance(in_RDI,in_ESI);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

inline bool CodedInputStream::Skip(int count) {
  if (count < 0) return false;  // security: count is often user-supplied

  const int original_buffer_size = BufferSize();

  if (count <= original_buffer_size) {
    // Just skipping within the current buffer.  Easy.
    Advance(count);
    return true;
  }

  return SkipFallback(count, original_buffer_size);
}